

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathway.c
# Opt level: O1

void init_pathway(pathway_t *record)

{
  record->id[0] = '\0';
  record->from_stop_id[0] = '\0';
  record->to_stop_id[0] = '\0';
  record->mode = PTMD_NOT_SET;
  record->is_bidirectional = PD_NOT_SET;
  record->reversed_signposted_as[0] = '\0';
  record->length = 0.0;
  record->traversal_time = 0;
  record->stair_count = 0;
  record->max_slope = 0.0;
  record->min_width = 0.0;
  record->signposted_as[0] = '\0';
  return;
}

Assistant:

void init_pathway(pathway_t *record) {
    strcpy(record->id, "");
    strcpy(record->from_stop_id, "");
    strcpy(record->to_stop_id, "");
    record->mode = PTMD_NOT_SET,
    record->is_bidirectional = PD_NOT_SET,
    record->length = 0.0,
    record->traversal_time = 0,
    record->stair_count = 0,
    record->max_slope = 0.0,
    record->min_width = 0.0,
    strcpy(record->signposted_as, "");
    strcpy(record->reversed_signposted_as, "");
}